

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void reindexDatabases(Parse *pParse,char *zColl)

{
  sqlite3 *psVar1;
  int iVar2;
  int iVar3;
  Db *pDVar4;
  HashElem *pHVar5;
  
  psVar1 = pParse->db;
  iVar2 = psVar1->nDb;
  if (0 < iVar2) {
    pDVar4 = psVar1->aDb;
    iVar3 = 0;
    do {
      pHVar5 = (pDVar4->pSchema->tblHash).first;
      if (pHVar5 != (HashElem *)0x0) {
        do {
          reindexTable(pParse,(Table *)pHVar5->data,zColl);
          pHVar5 = pHVar5->next;
        } while (pHVar5 != (HashElem *)0x0);
        iVar2 = psVar1->nDb;
      }
      iVar3 = iVar3 + 1;
      pDVar4 = pDVar4 + 1;
    } while (iVar3 < iVar2);
  }
  return;
}

Assistant:

static void reindexDatabases(Parse *pParse, char const *zColl){
  Db *pDb;                    /* A single database */
  int iDb;                    /* The database index number */
  sqlite3 *db = pParse->db;   /* The database connection */
  HashElem *k;                /* For looping over tables in pDb */
  Table *pTab;                /* A table in the database */

  assert( sqlite3BtreeHoldsAllMutexes(db) );  /* Needed for schema access */
  for(iDb=0, pDb=db->aDb; iDb<db->nDb; iDb++, pDb++){
    assert( pDb!=0 );
    for(k=sqliteHashFirst(&pDb->pSchema->tblHash);  k; k=sqliteHashNext(k)){
      pTab = (Table*)sqliteHashData(k);
      reindexTable(pParse, pTab, zColl);
    }
  }
}